

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

Vec_Ptr_t * Llb_ManComputeCutLo(Aig_Man_t *p)

{
  void *pvVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  size_t __size;
  
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  pVVar2->nCap = 100;
  pVVar2->nSize = 0;
  ppvVar3 = (void **)malloc(800);
  pVVar2->pArray = ppvVar3;
  pVVar4 = p->vCis;
  if (0 < pVVar4->nSize) {
    iVar5 = 100;
    __size = 0;
    iVar6 = 0;
    uVar7 = 0;
    do {
      pvVar1 = pVVar4->pArray[uVar7];
      if ((int)uVar7 == iVar5) {
        ppvVar3 = pVVar2->pArray;
        if (uVar7 < 0x10) {
          if (ppvVar3 == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(ppvVar3,0x80);
          }
          pVVar2->pArray = ppvVar3;
          iVar5 = 0x10;
        }
        else {
          if (ppvVar3 == (void **)0x0) {
            ppvVar3 = (void **)malloc(__size);
          }
          else {
            ppvVar3 = (void **)realloc(ppvVar3,__size);
          }
          pVVar2->pArray = ppvVar3;
          iVar5 = iVar6;
        }
      }
      else {
        ppvVar3 = pVVar2->pArray;
      }
      ppvVar3[uVar7] = pvVar1;
      uVar7 = uVar7 + 1;
      pVVar4 = p->vCis;
      iVar6 = iVar6 + 2;
      __size = __size + 0x10;
    } while ((long)uVar7 < (long)pVVar4->nSize);
    pVVar2->nSize = (int)uVar7;
    pVVar2->nCap = iVar5;
  }
  return pVVar2;
}

Assistant:

Vec_Ptr_t * Llb_ManComputeCutLo( Aig_Man_t * p )
{
    Vec_Ptr_t * vMinCut;
    Aig_Obj_t * pObj;
    int i;
    vMinCut = Vec_PtrAlloc( 100 );
    Aig_ManForEachCi( p, pObj, i )
        Vec_PtrPush( vMinCut, pObj );
    return vMinCut;
}